

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# service.c
# Opt level: O0

fnode_service_t * fnode_service_create(char *sn,char *dev_type)

{
  undefined4 *in_RSI;
  undefined8 *in_RDI;
  fnode_service_t *svc;
  fnode_service_t *local_8;
  
  local_8 = (fnode_service_t *)malloc(0x4c0);
  if (local_8 == (fnode_service_t *)0x0) {
    local_8 = (fnode_service_t *)0x0;
  }
  else {
    memset(local_8,0,0x4c0);
    local_8->ref_counter = 1;
    *(undefined8 *)local_8->sn = *in_RDI;
    *(undefined4 *)local_8->dev_type = *in_RSI;
    local_8->state = FSVC_INIT;
    local_8->socket = 0xffffffff;
    fnet_socket_init();
    fnode_service_create_iface_sockets((fnode_service_t *)0x1024fd);
  }
  return local_8;
}

Assistant:

fnode_service_t *fnode_service_create(char const sn[FSN_LENGTH], char const dev_type[FDEV_TYPE_LENGTH])
{
    fnode_service_t *svc = malloc(sizeof(fnode_service_t));
    if (!svc)
    {
        FLOG_ERR("Unable to allocate memory for nodes interlink");
        return 0;
    }
    memset(svc, 0, sizeof *svc);

    svc->ref_counter = 1;
    memcpy(svc->sn, sn, FSN_LENGTH);
    memcpy(svc->dev_type, dev_type, FDEV_TYPE_LENGTH);
    svc->state = FSVC_INIT;
    svc->socket = FNET_INVALID_SOCKET;

    fnet_socket_init();
    fnode_service_create_iface_sockets(svc);

    return svc;
}